

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O3

int jx9Builtin_strtok(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  sxu32 sVar1;
  jx9_user_func *pjVar2;
  jx9_value *pObj;
  sxi32 sVar3;
  char *pcVar4;
  char *pcVar5;
  undefined8 *puVar6;
  void *pvVar7;
  int nLen;
  int nMasklen;
  char *zInput;
  SyString sToken;
  jx9_aux_data sAux;
  sxu32 local_48;
  int local_44;
  char *local_40;
  SyString local_38;
  undefined8 *local_28;
  
  if (nArg < 2) {
    pjVar2 = pCtx->pFunc;
    sVar1 = (pjVar2->aAux).nUsed;
    if (((sVar1 != 0) && (pvVar7 = (pjVar2->aAux).pBase, pvVar7 != (void *)0x0)) &&
       (puVar6 = *(undefined8 **)((long)pvVar7 + (ulong)((sVar1 - 1) * (pjVar2->aAux).eSize)),
       puVar6 != (undefined8 *)0x0)) {
      local_44 = 0;
      if (((nArg == 1) && (pcVar4 = jx9_value_to_string(*apArg,&local_44), 0 < local_44)) &&
         (sVar3 = ExtractToken((char **)(puVar6 + 1),(char *)puVar6[2],pcVar4,local_44,&local_38),
         sVar3 == 0)) {
        jx9_value_string(pCtx->pRet,local_38.zString,local_38.nByte);
        return 0;
      }
      jx9_context_free_chunk(pCtx,(void *)*puVar6);
      jx9_context_free_chunk(pCtx,puVar6);
      sVar1 = (pCtx->pFunc->aAux).nUsed;
      if (sVar1 != 0) {
        (pCtx->pFunc->aAux).nUsed = sVar1 - 1;
      }
    }
  }
  else {
    pcVar4 = jx9_value_to_string(*apArg,(int *)&local_48);
    local_40 = pcVar4;
    if (0 < (int)local_48) {
      pcVar5 = jx9_value_to_string(apArg[1],&local_44);
      if (local_44 < 1) {
        local_44 = 5;
        pcVar5 = " \n\t\r\f";
      }
      sVar3 = ExtractToken(&local_40,pcVar4 + (int)local_48,pcVar5,local_44,&local_38);
      if (sVar3 == 0) {
        jx9_value_string(pCtx->pRet,local_38.zString,local_38.nByte);
        puVar6 = (undefined8 *)jx9_context_alloc_chunk(pCtx,0x18,1,0);
        pcVar5 = local_40;
        if (puVar6 == (undefined8 *)0x0) {
          return 0;
        }
        local_48 = ((int)pcVar4 - (int)local_40) + local_48;
        if (0 < (int)local_48) {
          pvVar7 = jx9_context_alloc_chunk(pCtx,local_48 + 1,1,0);
          if (pvVar7 == (void *)0x0) {
            return 0;
          }
          SyMemcpy(pcVar5,pvVar7,local_48);
          puVar6[1] = pvVar7;
          *puVar6 = pvVar7;
          puVar6[2] = (long)(int)local_48 + (long)pvVar7;
          local_28 = puVar6;
          SySetPut(&pCtx->pFunc->aAux,&local_28);
          return 0;
        }
        jx9_context_free_chunk(pCtx,puVar6);
        return 0;
      }
    }
  }
  pObj = pCtx->pRet;
  jx9MemObjRelease(pObj);
  (pObj->x).rVal = 0.0;
  pObj->iFlags = pObj->iFlags & 0xfffffe90U | 8;
  return 0;
}

Assistant:

static int jx9Builtin_strtok(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	strtok_aux_data *pAux;
	const char *zMask;
	SyString sToken; 
	int nMasklen;
	sxi32 rc;
	if( nArg < 2 ){
		/* Extract top aux data */
		pAux = (strtok_aux_data *)jx9_context_peek_aux_data(pCtx);
		if( pAux == 0 ){
			/* No aux data, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		nMasklen = 0;
		zMask = ""; /* cc warning */
		if( nArg > 0 ){
			/* Extract the mask */
			zMask = jx9_value_to_string(apArg[0], &nMasklen);
		}
		if( nMasklen < 1 ){
			/* Invalid mask, return FALSE */
			jx9_context_free_chunk(pCtx, (void *)pAux->zDup);
			jx9_context_free_chunk(pCtx, pAux);
			(void)jx9_context_pop_aux_data(pCtx);
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Extract the token */
		rc = ExtractToken(&pAux->zIn, pAux->zEnd, zMask, nMasklen, &sToken);
		if( rc != SXRET_OK ){
			/* EOF , discard the aux data */
			jx9_context_free_chunk(pCtx, (void *)pAux->zDup);
			jx9_context_free_chunk(pCtx, pAux);
			(void)jx9_context_pop_aux_data(pCtx);
			jx9_result_bool(pCtx, 0);
		}else{
			/* Return the extracted token */
			jx9_result_string(pCtx, sToken.zString, (int)sToken.nByte);
		}
	}else{
		const char *zInput, *zCur;
		char *zDup;
		int nLen;
		/* Extract the raw input */
		zCur = zInput = jx9_value_to_string(apArg[0], &nLen);
		if( nLen < 1 ){
			/* Empty input, return FALSE */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}
		/* Extract the mask */
		zMask = jx9_value_to_string(apArg[1], &nMasklen);
		if( nMasklen < 1 ){
			/* Set a default mask */
#define TOK_MASK " \n\t\r\f" 
			zMask = TOK_MASK;
			nMasklen = (int)sizeof(TOK_MASK) - 1;
#undef TOK_MASK
		}
		/* Extract a single token */
		rc = ExtractToken(&zInput, &zInput[nLen], zMask, nMasklen, &sToken);
		if( rc != SXRET_OK ){
			/* Empty input */
			jx9_result_bool(pCtx, 0);
			return JX9_OK;
		}else{
			/* Return the extracted token */
			jx9_result_string(pCtx, sToken.zString, (int)sToken.nByte);
		}
		/* Create our auxilliary data and copy the input */
		pAux = (strtok_aux_data *)jx9_context_alloc_chunk(pCtx, sizeof(strtok_aux_data), TRUE, FALSE);
		if( pAux ){
			nLen -= (int)(zInput-zCur);
			if( nLen < 1 ){
				jx9_context_free_chunk(pCtx, pAux);
				return JX9_OK;
			}
			/* Duplicate input */
			zDup = (char *)jx9_context_alloc_chunk(pCtx, (unsigned int)(nLen+1), TRUE, FALSE);
			if( zDup  ){
				SyMemcpy(zInput, zDup, (sxu32)nLen);
				/* Register the aux data */
				pAux->zDup = pAux->zIn = zDup;
				pAux->zEnd = &zDup[nLen];
				jx9_context_push_aux_data(pCtx, pAux);
			}
		}
	}
	return JX9_OK;
}